

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerThread.cxx
# Opt level: O0

shared_ptr<cmDebugger::cmDebuggerStackFrame> __thiscall
cmDebugger::cmDebuggerThread::GetTopStackFrame(cmDebuggerThread *this)

{
  bool bVar1;
  reference pvVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<cmDebugger::cmDebuggerStackFrame> sVar3;
  undefined1 local_28 [8];
  unique_lock<std::mutex> lock;
  cmDebuggerThread *this_local;
  
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_28,(mutex_type *)(in_RSI + 0x78));
  bVar1 = std::
          vector<std::shared_ptr<cmDebugger::cmDebuggerStackFrame>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>_>
          ::empty((vector<std::shared_ptr<cmDebugger::cmDebuggerStackFrame>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>_>
                   *)(in_RSI + 0x28));
  if (bVar1) {
    std::shared_ptr<cmDebugger::cmDebuggerStackFrame>::shared_ptr
              ((shared_ptr<cmDebugger::cmDebuggerStackFrame> *)this);
  }
  else {
    pvVar2 = std::
             vector<std::shared_ptr<cmDebugger::cmDebuggerStackFrame>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>_>
             ::back((vector<std::shared_ptr<cmDebugger::cmDebuggerStackFrame>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>_>
                     *)(in_RSI + 0x28));
    std::shared_ptr<cmDebugger::cmDebuggerStackFrame>::shared_ptr
              ((shared_ptr<cmDebugger::cmDebuggerStackFrame> *)this,pvVar2);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  sVar3.super___shared_ptr<cmDebugger::cmDebuggerStackFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  sVar3.super___shared_ptr<cmDebugger::cmDebuggerStackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cmDebugger::cmDebuggerStackFrame>)
         sVar3.super___shared_ptr<cmDebugger::cmDebuggerStackFrame,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<cmDebuggerStackFrame> cmDebuggerThread::GetTopStackFrame()
{
  std::unique_lock<std::mutex> lock(Mutex);
  if (!Frames.empty()) {
    return Frames.back();
  }

  return {};
}